

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_positional_scan.cpp
# Opt level: O1

ProgressData * __thiscall
duckdb::PhysicalPositionalScan::GetProgress
          (ProgressData *__return_storage_ptr__,PhysicalPositionalScan *this,ClientContext *context,
          GlobalSourceState *gstate_p)

{
  PhysicalOperator *pPVar1;
  uint uVar2;
  const_reference pvVar3;
  reference this_00;
  type pGVar4;
  size_type __n;
  uint uVar5;
  double dVar6;
  double dVar7;
  double local_48;
  double dStack_40;
  uint local_38;
  
  dVar6 = 0.0;
  __return_storage_ptr__->done = 0.0;
  __return_storage_ptr__->total = 0.0;
  __return_storage_ptr__->invalid = false;
  if ((this->child_tables).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->child_tables).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    dVar6 = 0.0;
  }
  else {
    uVar5 = (uint)__return_storage_ptr__->invalid;
    dVar7 = __return_storage_ptr__->total;
    __n = 0;
    do {
      pvVar3 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                         (&this->child_tables,__n);
      pPVar1 = pvVar3->_M_data;
      this_00 = vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>,_true>
                              *)(gstate_p + 1),__n);
      pGVar4 = unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
               ::operator*(this_00);
      (*pPVar1->_vptr_PhysicalOperator[0x17])(&local_48,pPVar1,context,pGVar4);
      uVar2 = uVar5 & 1;
      uVar5 = 1;
      if (uVar2 == 0) {
        uVar5 = local_38;
      }
      dVar6 = dVar6 + local_48;
      dVar7 = dVar7 + dStack_40;
      __n = __n + 1;
    } while (__n < (ulong)((long)(this->child_tables).
                                 super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                 .
                                 super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->child_tables).
                                 super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                 .
                                 super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
    __return_storage_ptr__->total = dVar7;
    __return_storage_ptr__->invalid = SUB41(uVar5,0);
  }
  __return_storage_ptr__->done = dVar6;
  return __return_storage_ptr__;
}

Assistant:

ProgressData PhysicalPositionalScan::GetProgress(ClientContext &context, GlobalSourceState &gstate_p) const {
	auto &gstate = gstate_p.Cast<PositionalScanGlobalSourceState>();

	ProgressData res;

	for (size_t t = 0; t < child_tables.size(); ++t) {
		res.Add(child_tables[t].get().GetProgress(context, *gstate.global_states[t]));
	}

	return res;
}